

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1514.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uStack_40;
  WriteThis pooh;
  
  pooh.readptr._0_4_ = 0x105098;
  pooh.readptr._4_4_ = 0;
  pooh.sizeleft._0_4_ = 5;
  pooh.sizeleft._4_4_ = 0;
  iVar1 = curl_global_init(3);
  uVar5 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar5,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1514.c"
                  ,0x3e,iVar1,uVar3);
    return iVar1;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    iVar1 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1514.c"
                  ,0x40);
  }
  else {
    iVar2 = curl_easy_setopt(lVar4,0x2712,URL);
    uVar5 = _stderr;
    if (iVar2 == 0) {
      iVar2 = curl_easy_setopt(lVar4,0x2f,1);
      uVar5 = _stderr;
      if (iVar2 == 0) {
        iVar2 = curl_easy_setopt(lVar4,0x4e2c,read_callback);
        uVar5 = _stderr;
        if (iVar2 == 0) {
          iVar2 = curl_easy_setopt(lVar4,0x2719,&pooh);
          uVar5 = _stderr;
          if (iVar2 == 0) {
            iVar1 = curl_easy_perform(lVar4);
            goto LAB_001023a7;
          }
          uVar3 = curl_easy_strerror(iVar2);
          uStack_40 = 0x46;
        }
        else {
          uVar3 = curl_easy_strerror(iVar2);
          uStack_40 = 0x45;
        }
      }
      else {
        uVar3 = curl_easy_strerror(iVar2);
        uStack_40 = 0x43;
      }
    }
    else {
      uVar3 = curl_easy_strerror(iVar2);
      uStack_40 = 0x42;
    }
    iVar1 = 0;
    curl_mfprintf(uVar5,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1514.c"
                  ,uStack_40,iVar2,uVar3);
  }
LAB_001023a7:
  curl_easy_cleanup(lVar4);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode result = CURLE_OK;
  int res = 0;
  struct WriteThis pooh = { data, sizeof(data)-1 };

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_POST, 1L);
  /* Purposely omit to set CURLOPT_POSTFIELDSIZE */
  easy_setopt(curl, CURLOPT_READFUNCTION, read_callback);
  easy_setopt(curl, CURLOPT_READDATA, &pooh);

  result = curl_easy_perform(curl);

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)result;
}